

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_magic_missile(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = dice(level,3);
  iVar3 = level + 3;
  if (-1 < level) {
    iVar3 = level;
  }
  iVar2 = (iVar3 >> 2) + iVar2;
  bVar1 = saves_spell(level,(CHAR_DATA *)vo,0xb);
  iVar3 = iVar2 / 2;
  if (!bVar1) {
    iVar3 = iVar2;
  }
  act("Missiles of pure mana streak from $n\'s hands to strike $N!",ch,(void *)0x0,vo,1);
  act("Missiles of pure mana streak from $n\'s hands to strike you!",ch,(void *)0x0,vo,2);
  act("Missiles of pure mana streak from your hands to strike $N!",ch,(void *)0x0,vo,3);
  damage_new(ch,(CHAR_DATA *)vo,iVar3,sn,0xb,true,false,0,1,"magic missiles$");
  return;
}

Assistant:

void spell_magic_missile(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam;

	dam = dice(level, 3);
	dam += level / 4;

	if (saves_spell(level, victim, DAM_ENERGY))
		dam /= 2;

	act("Missiles of pure mana streak from $n's hands to strike $N!", ch, 0, victim, TO_NOTVICT);
	act("Missiles of pure mana streak from $n's hands to strike you!", ch, 0, victim, TO_VICT);
	act("Missiles of pure mana streak from your hands to strike $N!", ch, 0, victim, TO_CHAR);

	damage_new(ch, victim, dam, sn, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "magic missiles$");
}